

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::SliceParameter::MergePartialFromCodedStream(SliceParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int64 iVar7;
  UnknownFieldSet *unknown_fields;
  char cVar8;
  uint tag;
  ulong uVar9;
  
LAB_003b127d:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b12a0;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b12a0:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_003b12c1:
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
    }
    else {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar6 == 3) {
        if (cVar8 != '\x18') goto LAB_003b12c1;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar9 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b13b3;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_003b13b3:
          uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar9 < 0) {
            return false;
          }
        }
        this->axis_ = (int32)uVar9;
        goto LAB_003b127d;
      }
      if (uVar6 != 2) {
        if ((uVar6 != 1) || (cVar8 != '\b')) goto LAB_003b12c1;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar5 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->slice_dim_ = (uint)bVar1;
            input->buffer_ = pbVar2 + 1;
            goto LAB_003b127d;
          }
        }
        else {
          uVar5 = 0;
        }
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        this->slice_dim_ = (uint32)iVar7;
        if (iVar7 < 0) {
          return false;
        }
        goto LAB_003b127d;
      }
      if (cVar8 == '\x12') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->slice_point_);
      }
      else {
        if ((tag & 0xff) != 0x10) goto LAB_003b12c1;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (1,0x10,input,&this->slice_point_);
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SliceParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.SliceParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 slice_dim = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_slice_dim();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &slice_dim_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint32 slice_point = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 1, 16u, input, this->mutable_slice_point())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, this->mutable_slice_point())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 axis = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.SliceParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.SliceParameter)
  return false;
#undef DO_
}